

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O2

void __thiscall
QPropertyAnimationPrivate::~QPropertyAnimationPrivate(QPropertyAnimationPrivate *this)

{
  (this->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate.
  super_QObjectData._vptr_QObjectData = (_func_int **)&PTR__QPropertyAnimationPrivate_00668598;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&this->propertyName);
  QVariantAnimationPrivate::~QVariantAnimationPrivate(&this->super_QVariantAnimationPrivate);
  return;
}

Assistant:

void QPropertyAnimationPrivate::updateMetaProperty()
{
    const QObject *target = targetObject.valueBypassingBindings();
    if (!target || propertyName.value().isEmpty()) {
        propertyType = QMetaType::UnknownType;
        propertyIndex = -1;
        return;
    }

    //propertyType will be set to a valid type only if there is a Q_PROPERTY
    //otherwise it will be set to QVariant::Invalid at the end of this function
    propertyType = target->property(propertyName.value()).userType();
    propertyIndex = target->metaObject()->indexOfProperty(propertyName.value());

    if (propertyType != QMetaType::UnknownType)
        convertValues(propertyType);
    if (propertyIndex == -1) {
        //there is no Q_PROPERTY on the object
        propertyType = QMetaType::UnknownType;
        if (!target->dynamicPropertyNames().contains(propertyName))
            qWarning("QPropertyAnimation: you're trying to animate a non-existing property %s of "
                     "your QObject",
                     propertyName.value().constData());
    } else if (!target->metaObject()->property(propertyIndex).isWritable()) {
        qWarning("QPropertyAnimation: you're trying to animate the non-writable property %s of "
                 "your QObject",
                 propertyName.value().constData());
    }
}